

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.h
# Opt level: O0

void __thiscall kws::Parser::SetBuffer(Parser *this,string *buffer)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  string *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  string *in_stack_00000008;
  size_t currentPosition;
  char *currentCharacter;
  char *in_stack_000000b0;
  Parser *in_stack_000000b8;
  value_type_conflict *in_stack_ffffffffffffffa8;
  value_type_conflict *__x;
  string local_30 [48];
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0x35),in_RSI);
  ConvertBufferToWindowsFileType((Parser *)currentPosition,in_stack_00000008);
  std::__cxx11::string::operator=
            ((string *)
             &in_RDI[0x37].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,(string *)(in_RDI + 0x35));
  RemoveComments_abi_cxx11_(in_stack_000000b8,in_stack_000000b0);
  std::__cxx11::string::~string(local_30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11be81);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_RDI,in_stack_ffffffffffffffa8);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)std::__cxx11::string::c_str();
  __x = (value_type_conflict *)0x0;
  while (*(char *)&(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start != '\0') {
    if (*(char *)&(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start == '\n') {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,__x);
    }
    __x = (value_type_conflict *)((long)__x + 1);
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)&(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,__x);
  return;
}

Assistant:

void SetBuffer(std::string buffer) 
    {
    m_Buffer = buffer;
    this->ConvertBufferToWindowsFileType(m_Buffer);
    m_FixedBuffer = m_Buffer;
    this->RemoveComments();

    //Fill up the m_positions vector
    m_Positions.clear();
    m_Positions.push_back(0);
    const char* currentCharacter = m_Buffer.c_str();
    size_t currentPosition = 0;
    while( *currentCharacter )
      {
      if( (*currentCharacter) == '\n' )
        m_Positions.push_back(currentPosition);
      currentPosition++;
      currentCharacter++;
      }
    m_Positions.push_back(currentPosition);
    }